

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O0

int m_mainloop(void)

{
  int iVar1;
  
  while (sys_quit != 1) {
    if (sched_useaudio == 2) {
      m_callbackscheduler();
    }
    else {
      m_pollingscheduler();
    }
    if (sys_quit == 2) {
      sys_quit = 0;
      iVar1 = audio_isopen();
      if (iVar1 != 0) {
        sys_close_audio();
        sys_reopen_audio();
      }
    }
  }
  return 0;
}

Assistant:

int m_mainloop(void)
{
    while (sys_quit != SYS_QUIT_QUIT)
    {
        if (sched_useaudio == SCHED_AUDIO_CALLBACK)
            m_callbackscheduler();
        else m_pollingscheduler();
        if (sys_quit == SYS_QUIT_RESTART)
        {
            sys_quit = 0;
            if (audio_isopen())
            {
                sys_close_audio();
                sys_reopen_audio();
            }
        }
    }
    return (0);
}